

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O0

bool speak_with_file(string *command,string *text,string *path,int voice_id)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int ret;
  ofstream speak_file;
  undefined7 in_stack_fffffffffffffd18;
  string local_2e0 [16];
  char *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd5c;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [36];
  int local_23c;
  undefined4 local_238;
  char local_228 [551];
  byte local_1;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_228,pcVar3,_S_out);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write(local_228,(long)__rhs);
    std::ofstream::close();
    std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::__cxx11::to_string(in_stack_fffffffffffffd5c);
    std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffd18),(char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffd18),__rhs);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = system(pcVar3);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd40);
    local_23c = iVar2;
    if (iVar2 == 0) {
      local_1 = 1;
    }
    else {
      fprintf(_stderr,"%s: failed to speak\n","speak_with_file");
      local_1 = 0;
    }
  }
  else {
    fprintf(_stderr,"%s: failed to open speak_file\n","speak_with_file");
    local_1 = 0;
  }
  local_238 = 1;
  std::ofstream::~ofstream(local_228);
  return (bool)(local_1 & 1);
}

Assistant:

bool speak_with_file(const std::string & command, const std::string & text, const std::string & path, int voice_id) {
    std::ofstream speak_file(path.c_str());
    if (speak_file.fail()) {
        fprintf(stderr, "%s: failed to open speak_file\n", __func__);
        return false;
    } else {
        speak_file.write(text.c_str(), text.size());
        speak_file.close();
        int ret = system((command + " " + std::to_string(voice_id) + " " + path).c_str());
        if (ret != 0) {
            fprintf(stderr, "%s: failed to speak\n", __func__);
            return false;
        }
    }
    return true;
}